

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_CDEject(SDL12_CD *cdrom)

{
  SDL12_CD *pSVar1;
  SDL12_CD *cdrom_local;
  
  pSVar1 = ValidCDDevice(cdrom);
  if (pSVar1 == (SDL12_CD *)0x0) {
    cdrom_local._4_4_ = -1;
  }
  else {
    (*SDL20_LockAudio)();
    if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
      audio_cbdata->cdrom_status = SDL12_CD_TRAYEMPTY;
      FreeMp3(&audio_cbdata->cdrom_mp3);
    }
    pSVar1->status = SDL12_CD_TRAYEMPTY;
    (*SDL20_UnlockAudio)();
    cdrom_local._4_4_ = 0;
  }
  return cdrom_local._4_4_;
}

Assistant:

SDLCALL
SDL_CDEject(SDL12_CD *cdrom)
{
    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }

    SDL20_LockAudio();
    if (audio_cbdata) {
        audio_cbdata->cdrom_status = SDL12_CD_TRAYEMPTY;
        FreeMp3(&audio_cbdata->cdrom_mp3);
    }
    cdrom->status = SDL12_CD_TRAYEMPTY;
    SDL20_UnlockAudio();
    return 0;
}